

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  TestCase *pTVar5;
  int width;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  TimeInMillis ms;
  int i;
  allocator local_2f1;
  tm time_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  int local_294;
  string kIndent;
  string kTestsuites;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&kTestsuites,"testsuites",(allocator *)&time_struct);
  Indent_abi_cxx11_(&kIndent,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::__cxx11::string::string((string *)&time_struct,"tests",(allocator *)&local_2b8);
  iVar2 = UnitTest::reportable_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,iVar2,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&time_struct,"failures",(allocator *)&local_2b8);
  iVar2 = UnitTest::failed_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,iVar2,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&time_struct,"disabled",(allocator *)&local_2b8);
  iVar2 = UnitTest::reportable_disabled_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,iVar2,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&time_struct,"errors",(allocator *)&local_2b8);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,0,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string((string *)&time_struct,"random_seed",(allocator *)&local_2b8);
    OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,unit_test->impl_->random_seed_,&kIndent
                  ,true);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::string((string *)&local_210,"timestamp",&local_2f1);
  bVar1 = PortableLocaltime(unit_test->impl_->start_timestamp_ / 1000,&time_struct);
  if (bVar1) {
    local_294 = time_struct.tm_year + 0x76c;
    StreamableToString<int>(&local_170,&local_294);
    std::operator+(&local_150,&local_170,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_190,(String *)(ulong)(time_struct.tm_mon + 1),value);
    std::operator+(&local_130,&local_150,&local_190);
    std::operator+(&local_110,&local_130,"-");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1b0,(String *)(ulong)(uint)time_struct.tm_mday,value_00);
    std::operator+(&local_f0,&local_110,&local_1b0);
    std::operator+(&local_d0,&local_f0,"T");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1d0,(String *)(ulong)(uint)time_struct.tm_hour,value_01);
    std::operator+(&local_b0,&local_d0,&local_1d0);
    std::operator+(&local_90,&local_b0,":");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1f0,(String *)(ulong)(uint)time_struct.tm_min,value_02);
    std::operator+(&local_70,&local_90,&local_1f0);
    std::operator+(&local_230,&local_70,":");
    String::FormatIntWidth2_abi_cxx11_(&local_50,(String *)(ulong)(uint)time_struct.tm_sec,value_03)
    ;
    std::operator+(&local_2b8,&local_230,&local_50);
    std::operator+(&local_250,&local_2b8,"Z");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string((string *)&local_250,"",(allocator *)&local_2b8);
  }
  OutputJsonKey(stream,&kTestsuites,&local_210,&local_250,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&time_struct,"time",(allocator *)&local_230);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_2b8,(internal *)unit_test->impl_->elapsed_time_,ms)
  ;
  bVar1 = false;
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,&local_2b8,&kIndent,false);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  TestPropertiesAsJson((string *)&time_struct,&unit_test->impl_->ad_hoc_test_result_,&kIndent);
  poVar4 = std::operator<<(stream,(string *)&time_struct);
  std::operator<<(poVar4,",\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&time_struct,"name",(allocator *)&local_230);
  std::__cxx11::string::string((string *)&local_2b8,"AllTests",(allocator *)&local_70);
  OutputJsonKey(stream,&kTestsuites,(string *)&time_struct,&local_2b8,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  poVar4 = std::operator<<(stream,(string *)&kIndent);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)&kTestsuites);
  std::operator<<(poVar4,"\": [\n");
  for (iVar2 = 0;
      iVar2 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(unit_test->impl_->test_cases_).
                                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar2 = iVar2 + 1
      ) {
    pTVar5 = UnitTest::GetTestCase(unit_test,iVar2);
    iVar3 = TestCase::reportable_test_count(pTVar5);
    if (0 < iVar3) {
      if (bVar1) {
        std::operator<<(stream,",\n");
      }
      pTVar5 = UnitTest::GetTestCase(unit_test,iVar2);
      PrintJsonTestCase(stream,pTVar5);
      bVar1 = true;
    }
  }
  poVar4 = std::operator<<(stream,"\n");
  poVar4 = std::operator<<(poVar4,(string *)&kIndent);
  poVar4 = std::operator<<(poVar4,"]\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}